

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

Literal getInt(int line)

{
  char *__ptr;
  ulong uVar1;
  ulong uVar2;
  Literal LVar3;
  long l;
  anon_union_8_4_50a03f35_for_Literal_2 local_20;
  
  do {
    __ptr = readString();
    uVar1 = (ulong)((*__ptr - 0x2bU & 0xfd) == 0);
    uVar2 = uVar1;
    while( true ) {
      if (__ptr[uVar2] == '\0') break;
      if ((byte)(__ptr[uVar2] - 0x3aU) < 0xf6) goto LAB_00106486;
      uVar2 = uVar2 + 1;
    }
    if ((uVar1 == 0) || (uVar2 != 1)) {
      local_20.iVal = 0;
      __isoc99_sscanf(__ptr,"%ld",&local_20);
      free(__ptr);
      LVar3._0_8_ = (ulong)(uint)line | 0x100000000;
      LVar3.field_2.iVal = local_20.iVal;
      return LVar3;
    }
LAB_00106486:
    printf("\x1b[33m\n[Warning] [Input Error] Not an integer : %s!\n[Re-Input] \x1b[0m",__ptr);
  } while( true );
}

Assistant:

Literal getInt(int line){
    char *s = readString();
    while(!isInt(s)){
        printf(warning("[Input Error] Not an integer : %s!\n[Re-Input] "), s);
        s = readString();
    }
    long l = 0;
    sscanf(s, "%ld", &l);
    memfree(s);
    Literal lit = {line, LIT_INT, {0}};
    lit.iVal = l;
    return lit;
}